

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O3

void __thiscall
wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::
doEndTryTable(CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
              *this,CoalesceLocals *self,Expression **currp)

{
  _Base_ptr *pp_Var1;
  BranchUtils *this_00;
  size_t *psVar2;
  iterator __position;
  long lVar3;
  void *pvVar4;
  vector<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*>>
  *this_01;
  _Base_ptr p_Var5;
  size_t *psVar6;
  undefined1 auStack_88 [8];
  Name target;
  undefined1 local_70 [8];
  NameSet catchTargets;
  BasicBlock *pred;
  
  this_00 = (BranchUtils *)
            (self->
            super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
            ).super_Pass._vptr_Pass;
  if (*this_00 == (BranchUtils)0x35) {
    catchTargets._M_t._M_impl._0_4_ = 0;
    catchTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    catchTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    catchTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    catchTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&catchTargets;
    catchTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&catchTargets;
    BranchUtils::
    operateOnScopeNameUses<wasm::BranchUtils::getUniqueTargets(wasm::Expression*)::_lambda(wasm::Name&)_1_>
              (this_00,(Expression *)local_70,(anon_class_8_1_ba1d7401)currp);
    if (catchTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
        (_Base_ptr)&catchTargets) {
      p_Var5 = catchTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        auStack_88 = *(undefined1 (*) [8])(p_Var5 + 1);
        target.super_IString.str._M_len = (size_t)p_Var5[1]._M_parent;
        psVar2 = *(size_t **)(*(long *)&this->hasSyntheticExit + -0x10);
        for (psVar6 = *(size_t **)(*(long *)&this->hasSyntheticExit + -0x18); psVar6 != psVar2;
            psVar6 = psVar6 + 1) {
          catchTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = *psVar6;
          this_01 = (vector<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*>>
                     *)std::
                       map<wasm::Name,_std::vector<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
                       ::operator[]((map<wasm::Name,_std::vector<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
                                     *)&(this->loopLastBlockStack).
                                        super__Vector_base<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (key_type *)auStack_88);
          __position._M_current = *(BasicBlock ***)(this_01 + 8);
          if (__position._M_current == *(BasicBlock ***)(this_01 + 0x10)) {
            std::
            vector<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*>>
            ::
            _M_realloc_insert<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*const&>
                      (this_01,__position,
                       (BasicBlock **)&catchTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
                      );
          }
          else {
            *__position._M_current =
                 (BasicBlock *)catchTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
            *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
          }
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while (p_Var5 != (_Rb_tree_node_base *)&catchTargets);
    }
    lVar3 = *(long *)&this->hasSyntheticExit;
    *(long *)&this->hasSyntheticExit = lVar3 + -0x18;
    pvVar4 = *(void **)(lVar3 + -0x18);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,*(long *)(lVar3 + -8) - (long)pvVar4);
    }
    pp_Var1 = &(this->debugIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    *pp_Var1 = (_Base_ptr)&(*pp_Var1)[-1]._M_right;
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)local_70);
    return;
  }
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                ,0x31b,"T *wasm::Expression::cast() [T = wasm::TryTable]");
}

Assistant:

static void doEndTryTable(SubType* self, Expression** currp) {
    auto* curr = (*currp)->cast<TryTable>();

    auto catchTargets = BranchUtils::getUniqueTargets(curr);
    // Add catch destinations to the targets.
    for (auto target : catchTargets) {
      auto& preds = self->throwingInstsStack.back();
      for (auto* pred : preds) {
        self->branches[target].push_back(pred);
      }
    }

    self->throwingInstsStack.pop_back();
    self->tryStack.pop_back();
  }